

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O3

bool run_test_type_conversion<std::shared_ptr<long>&>(Boxed_Value *bv,bool expectedpass)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 *local_20;
  long local_18;
  
  chaiscript::boxed_cast<std::shared_ptr<long>&>
            ((chaiscript *)&local_20,bv,(Type_Conversions_State *)0x0);
  uVar1 = *local_20;
  *(undefined8 *)(local_18 + 0x20) = uVar1;
  *(undefined8 *)(local_18 + 0x28) = uVar1;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20[1];
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return expectedpass;
}

Assistant:

bool run_test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  try {
    To ret = chaiscript::boxed_cast<To>(bv);
    use(ret);
  } catch (const chaiscript::exception::bad_boxed_cast &e) {
    if (expectedpass) {
      std::cerr << "Failure in run_test_type_conversion: " << e.what() << '\n';
      return false;
    }
    return true;
  } catch (const std::exception &e) {
    std::cerr << "Unexpected standard exception when attempting cast_conversion: " << e.what() << '\n';
    return false;
  } catch (...) {
    std::cerr << "Unexpected unknown exception when attempting cast_conversion.\n";
    return false;
  }

  return expectedpass;
}